

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_info__stdio(ma_vfs *pVFS,ma_vfs_file file,ma_file_info *pInfo)

{
  int iVar1;
  int *piVar2;
  undefined1 local_c0 [8];
  stat info;
  int fd;
  ma_file_info *pInfo_local;
  ma_vfs_file file_local;
  ma_vfs *pVFS_local;
  
  if (file == (ma_vfs_file)0x0) {
    __assert_fail("file != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                  ,0xad86,
                  "ma_result ma_default_vfs_info__stdio(ma_vfs *, ma_vfs_file, ma_file_info *)");
  }
  if (pInfo != (ma_file_info *)0x0) {
    info.__glibc_reserved[2]._4_4_ = fileno((FILE *)file);
    iVar1 = fstat(info.__glibc_reserved[2]._4_4_,(stat *)local_c0);
    if (iVar1 == 0) {
      pInfo->sizeInBytes = info.st_rdev;
      pVFS_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      pVFS_local._4_4_ = ma_result_from_errno(*piVar2);
    }
    return pVFS_local._4_4_;
  }
  __assert_fail("pInfo != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                ,0xad87,
                "ma_result ma_default_vfs_info__stdio(ma_vfs *, ma_vfs_file, ma_file_info *)");
}

Assistant:

static ma_result ma_default_vfs_info__stdio(ma_vfs* pVFS, ma_vfs_file file, ma_file_info* pInfo)
{
    int fd;
    struct stat info;

    MA_ASSERT(file  != NULL);
    MA_ASSERT(pInfo != NULL);

    (void)pVFS;

#if defined(_MSC_VER)
    fd = _fileno((FILE*)file);
#else
    fd =  fileno((FILE*)file);
#endif

    if (fstat(fd, &info) != 0) {
        return ma_result_from_errno(errno);
    }

    pInfo->sizeInBytes = info.st_size;

    return MA_SUCCESS;
}